

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_MeshInterface.cpp
# Opt level: O2

udword __thiscall Opcode::MeshInterface::CheckTopology(MeshInterface *this)

{
  udword uVar1;
  IndexedTriangle *pIVar2;
  udword uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  
  uVar4 = (ulong)this->mNbTris;
  pIVar2 = this->mTris;
  uVar1 = this->mVertexStride;
  uVar5 = 0;
  uVar3 = 0;
  while( true ) {
    bVar10 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar10) break;
    uVar8 = (ulong)uVar5;
    iVar6 = *(int *)((long)pIVar2->mVRef + uVar8) * uVar1;
    iVar9 = *(int *)((long)pIVar2->mVRef + uVar8 + 4) * uVar1;
    if (((iVar6 == iVar9) ||
        (iVar7 = *(int *)((long)pIVar2->mVRef + uVar8 + 8) * uVar1, iVar9 == iVar7)) ||
       (iVar7 == iVar6)) {
      uVar3 = uVar3 + 1;
    }
    uVar5 = uVar5 + this->mTriStride;
  }
  return uVar3;
}

Assistant:

udword MeshInterface::CheckTopology()	const
{
	// Check topology. If the model contains degenerate faces, collision report can be wrong in some cases.
	// e.g. it happens with the standard MAX teapot. So clean your meshes first... If you don't have a mesh cleaner
	// you can try this: www.codercorner.com/Consolidation.zip

	udword NbDegenerate = 0;

	VertexPointers VP;

	// Using callbacks, we don't have access to vertex indices. Nevertheless we still can check for
	// redundant vertex pointers, which cover all possibilities (callbacks/pointers/strides).
	for(udword i=0;i<mNbTris;i++)
	{
		GetTriangle(VP, i);

		if(		(VP.Vertex[0]==VP.Vertex[1])
			||	(VP.Vertex[1]==VP.Vertex[2])
			||	(VP.Vertex[2]==VP.Vertex[0]))	NbDegenerate++;
	}

	return NbDegenerate;
}